

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O1

UserObject * __thiscall
camp::Class::construct(UserObject *__return_storage_ptr__,Class *this,Args *args)

{
  pointer psVar1;
  element_type *peVar2;
  char cVar3;
  pointer psVar4;
  
  psVar4 = (this->m_constructors).
           super__Vector_base<std::shared_ptr<camp::Constructor>,_std::allocator<std::shared_ptr<camp::Constructor>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_constructors).
           super__Vector_base<std::shared_ptr<camp::Constructor>,_std::allocator<std::shared_ptr<camp::Constructor>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (psVar4 == psVar1) {
      UserObject::UserObject(__return_storage_ptr__,(UserObject *)UserObject::nothing);
      return __return_storage_ptr__;
    }
    peVar2 = (psVar4->super___shared_ptr<camp::Constructor,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    cVar3 = (**(code **)(*(long *)peVar2 + 0x10))(peVar2,args);
    if (cVar3 != '\0') break;
    psVar4 = psVar4 + 1;
  }
  (**(code **)(*(long *)peVar2 + 0x18))(__return_storage_ptr__,peVar2,args);
  return __return_storage_ptr__;
}

Assistant:

UserObject Class::construct(const Args& args) const
{
    // Search an arguments match among the list of available constructors
    ConstructorList::const_iterator end = m_constructors.end();
    for (ConstructorList::const_iterator it = m_constructors.begin();
         it != end;
         ++it)
    {
        Constructor& constructor = **it;
        if (constructor.matches(args))
        {
            // Match found: use the constructor to create the new instance
            return constructor.create(args);
        }
    }

    // No match found
    return UserObject::nothing;
}